

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrReach.c
# Opt level: O0

DdNode ** Aig_ManCreatePartitions(DdManager *dd,Aig_Man_t *p,int fReorder,int fVerbose)

{
  Vec_Ptr_t *p_00;
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  DdNode **nodeArray;
  Aig_Obj_t *pObj;
  DdNode *pDVar5;
  DdNode *g;
  int local_3c;
  int i;
  Aig_Obj_t *pNode;
  DdNode *bVar;
  DdNode **pbParts;
  int fVerbose_local;
  int fReorder_local;
  Aig_Man_t *p_local;
  DdManager *dd_local;
  
  iVar3 = dd->size;
  iVar2 = Saig_ManCiNum(p);
  if (iVar3 == iVar2) {
    iVar3 = Saig_ManCiNum(p);
    iVar2 = Saig_ManRegNum(p);
    Cudd_bddIthVar(dd,iVar3 + iVar2 + -1);
    if (fReorder == 0) {
      Cudd_AutodynDisable(dd);
    }
    else {
      Cudd_AutodynEnable(dd,CUDD_REORDER_SYMM_SIFT);
    }
    iVar3 = Saig_ManRegNum(p);
    nodeArray = (DdNode **)malloc((long)iVar3 << 3);
    for (local_3c = 0; iVar3 = Saig_ManRegNum(p), local_3c < iVar3; local_3c = local_3c + 1) {
      p_00 = p->vCos;
      iVar3 = Saig_ManPoNum(p);
      pObj = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_3c + iVar3);
      iVar3 = Saig_ManCiNum(p);
      pDVar5 = Cudd_bddIthVar(dd,iVar3 + local_3c);
      g = Aig_ObjGlobalBdd(pObj);
      pDVar5 = Cudd_bddXnor(dd,pDVar5,g);
      nodeArray[local_3c] = pDVar5;
      Cudd_Ref(nodeArray[local_3c]);
    }
    Aig_ManFreeGlobalBdds(p,dd);
    pFVar1 = _stdout;
    if (fReorder != 0) {
      if (fVerbose != 0) {
        iVar3 = Saig_ManRegNum(p);
        uVar4 = Cudd_SharingSize(nodeArray,iVar3);
        fprintf(pFVar1,"BDD nodes in the partitions before reordering %d.\n",(ulong)uVar4);
      }
      Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
      Cudd_AutodynDisable(dd);
      pFVar1 = _stdout;
      if (fVerbose != 0) {
        iVar3 = Saig_ManRegNum(p);
        uVar4 = Cudd_SharingSize(nodeArray,iVar3);
        fprintf(pFVar1,"BDD nodes in the partitions after reordering %d.\n",(ulong)uVar4);
      }
    }
    return nodeArray;
  }
  __assert_fail("dd->size == Saig_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/bbr/bbrReach.c"
                ,0xc3,"DdNode **Aig_ManCreatePartitions(DdManager *, Aig_Man_t *, int, int)");
}

Assistant:

DdNode ** Aig_ManCreatePartitions( DdManager * dd, Aig_Man_t * p, int fReorder, int fVerbose )
{
    DdNode ** pbParts;
    DdNode * bVar;
    Aig_Obj_t * pNode;
    int i;

    // extand the BDD manager to represent NS variables
    assert( dd->size == Saig_ManCiNum(p) );
    Cudd_bddIthVar( dd, Saig_ManCiNum(p) + Saig_ManRegNum(p) - 1 );

    // enable reordering
    if ( fReorder )
        Cudd_AutodynEnable( dd, CUDD_REORDER_SYMM_SIFT );
    else
        Cudd_AutodynDisable( dd );

    // compute the transition relation
    pbParts = ABC_ALLOC( DdNode *, Saig_ManRegNum(p) );
    Saig_ManForEachLi( p, pNode, i )
    {
        bVar  = Cudd_bddIthVar( dd, Saig_ManCiNum(p) + i );
        pbParts[i] = Cudd_bddXnor( dd, bVar, Aig_ObjGlobalBdd(pNode) );  Cudd_Ref( pbParts[i] );
    }
    // free global BDDs
    Aig_ManFreeGlobalBdds( p, dd );

    // reorder and disable reordering
    if ( fReorder )
    {
        if ( fVerbose )
            fprintf( stdout, "BDD nodes in the partitions before reordering %d.\n", Cudd_SharingSize(pbParts,Saig_ManRegNum(p)) );
        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
        Cudd_AutodynDisable( dd );
        if ( fVerbose )
            fprintf( stdout, "BDD nodes in the partitions after reordering %d.\n", Cudd_SharingSize(pbParts,Saig_ManRegNum(p)) );
    }
    return pbParts;
}